

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# XSValueTest.cpp
# Opt level: O0

void testNoCanRep(char *data,DataType datatype,Status expStatus)

{
  char *pcVar1;
  XMLCh *pXVar2;
  void *pvVar3;
  char *pcVar4;
  char *pcVar5;
  StrX local_38;
  void *local_28;
  XMLCh *canRep;
  Status local_18;
  Status ret_Status;
  Status expStatus_local;
  DataType datatype_local;
  char *data_local;
  
  canRep._4_4_ = st_Init;
  local_18 = expStatus;
  ret_Status = datatype;
  _expStatus_local = data;
  StrX::StrX(&local_38,data);
  pXVar2 = StrX::unicodeForm(&local_38);
  pvVar3 = (void *)xercesc_4_0::XSValue::getCanonicalRepresentation
                             (pXVar2,ret_Status,(Status *)((long)&canRep + 4),ver_10,true,
                              xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
  StrX::~StrX(&local_38);
  pcVar1 = _expStatus_local;
  local_28 = pvVar3;
  if (pvVar3 == (void *)0x0) {
    if (canRep._4_4_ != local_18) {
      pcVar4 = getStatusString(canRep._4_4_);
      pcVar5 = getStatusString(local_18);
      printf("testNoCanRep fails, data=<%s> retStatus=<%s> expStatus=<%s>\n",pcVar1,pcVar4,pcVar5);
      errSeen = true;
    }
  }
  else {
    printf("testNoCanRep fails, data=<%s>\n",_expStatus_local);
    if (local_28 != (void *)0x0) {
      operator_delete(local_28,2);
    }
    errSeen = true;
  }
  return;
}

Assistant:

void  testNoCanRep(const char*                  const  data
                 , const XSValue::DataType             datatype
                 , const XSValue::Status               expStatus)
{
    XSValue::Status ret_Status = XSValue::st_Init;
    XMLCh* canRep = XSValue::getCanonicalRepresentation(StrX(data).unicodeForm(), datatype, ret_Status);

    if (canRep)
    {
        printf("testNoCanRep fails, data=<%s>\n", data);
        delete canRep;
        errSeen=true;
        return;
    }

    if (ret_Status != expStatus)
    {
        printf("testNoCanRep fails, data=<%s> retStatus=<%s> expStatus=<%s>\n",
                data
              , getStatusString(ret_Status)
              , getStatusString(expStatus));
        errSeen=true;
    }
}